

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O0

int16_t WebRtcIsac_UpdateBandwidthEstimator
                  (BwEstimatorstr *bwest_str,uint16_t rtp_number,int32_t frame_length,
                  uint32_t send_ts,uint32_t arr_ts,size_t pksize)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float local_84;
  float local_78;
  float local_70;
  float averageLatencyMs;
  float latencyMs;
  float inv_bitrate;
  int num_pkts_expected;
  int immediate_set;
  float late_diff;
  float delay_correction_factor;
  float arr_time_noise_abs;
  float arr_time_noise;
  float send_ts_diff;
  float arr_ts_diff;
  float t_diff_proj;
  float rec_rtp_rate;
  float curr_bw_inv;
  float weight;
  size_t pksize_local;
  uint32_t arr_ts_local;
  uint32_t send_ts_local;
  int32_t frame_length_local;
  uint16_t rtp_number_local;
  BwEstimatorstr *bwest_str_local;
  
  immediate_set = 0x3f800000;
  bVar2 = false;
  if ((bwest_str->external_bw_info).in_use == 0) {
    if (frame_length != bwest_str->prev_frame_length) {
      bwest_str->rec_header_rate = 280000.0 / (float)frame_length;
    }
    local_70 = (float)pksize;
    fVar3 = (local_70 * 8.0 * 1000.0) / (float)frame_length + bwest_str->rec_header_rate;
    if (arr_ts < bwest_str->prev_rec_arr_ts) {
      bwest_str->prev_rec_arr_ts = arr_ts;
      bwest_str->last_update_ts = arr_ts;
      bwest_str->last_reduction_ts = arr_ts + 48000;
      bwest_str->num_pkts_rec = 0;
      bwest_str->prev_frame_length = frame_length;
      bwest_str->prev_rec_rtp_rate = fVar3;
      bwest_str->prev_rec_rtp_number = (uint)rtp_number;
    }
    else {
      bwest_str->num_pkts_rec = bwest_str->num_pkts_rec + 1;
      if (bwest_str->count_tot_updates_rec < 1) {
        bwest_str->last_update_ts = arr_ts;
        bwest_str->last_reduction_ts = arr_ts + 48000;
        bwest_str->num_pkts_rec = 0;
        bwest_str->count_tot_updates_rec = bwest_str->count_tot_updates_rec + 1;
      }
      else {
        if (0 < bwest_str->in_wait_period) {
          bwest_str->in_wait_period = bwest_str->in_wait_period + -1;
        }
        bwest_str->inWaitLatePkts =
             bwest_str->inWaitLatePkts - (ushort)(0 < bwest_str->inWaitLatePkts);
        fVar4 = (float)(send_ts - bwest_str->prev_rec_send_ts);
        if ((float)(frame_length << 5) < fVar4) {
          bwest_str->last_reduction_ts = arr_ts + 48000;
          bwest_str->last_update_ts = arr_ts;
          bwest_str->num_pkts_rec = 0;
        }
        else if (3000.0 < ((float)(arr_ts - bwest_str->last_update_ts) * 1000.0) / 16000.0) {
          if ((float)bwest_str->num_pkts_rec /
              (float)(int)((((float)(arr_ts - bwest_str->last_update_ts) * 1000.0) / 16000.0) /
                          (float)frame_length) <= 0.9) {
            bwest_str->last_reduction_ts = arr_ts + 48000;
            bwest_str->last_update_ts = arr_ts;
            bwest_str->num_pkts_rec = 0;
          }
          else {
            dVar6 = pow(0.99995,(double)(((float)(arr_ts - bwest_str->last_reduction_ts) * 1000.0) /
                                        16000.0));
            fVar5 = (float)dVar6;
            if ((fVar5 != 0.0) || (NAN(fVar5))) {
              bwest_str->rec_bw_inv = bwest_str->rec_bw_inv / fVar5;
              if ((bwest_str->hsn_detect_snd != 0) &&
                 ((bwest_str->hsn_detect_rec != 0 && (6.6e-05 < bwest_str->rec_bw_inv)))) {
                bwest_str->rec_bw_inv = 6.6e-05;
              }
            }
            else {
              bwest_str->rec_bw_inv = 4.054054e-05;
            }
            bwest_str->last_reduction_ts = arr_ts;
          }
        }
        if (frame_length != bwest_str->prev_frame_length) {
          bwest_str->count_tot_updates_rec = 10;
          bwest_str->rec_header_rate = 280000.0 / (float)frame_length;
          bwest_str->rec_bw_inv = 1.0 / ((float)bwest_str->rec_bw + bwest_str->rec_header_rate);
        }
        arr_time_noise = (float)(arr_ts - bwest_str->prev_rec_arr_ts);
        if (fVar4 <= 0.0) {
          fVar4 = (float)(frame_length << 4);
        }
        num_pkts_expected = (int)(arr_time_noise - fVar4);
        if (((float)num_pkts_expected <= 0.0) || (bwest_str->inWaitLatePkts != 0)) {
          bwest_str->numConsecLatePkts = 0;
          bwest_str->consecLatency = 0.0;
        }
        else {
          bwest_str->numConsecLatePkts = bwest_str->numConsecLatePkts + 1;
          bwest_str->consecLatency = (float)num_pkts_expected + bwest_str->consecLatency;
        }
        bVar2 = 0x32 < bwest_str->numConsecLatePkts;
        if (bVar2) {
          immediate_set =
               (int)((float)frame_length /
                    ((float)frame_length +
                    (bwest_str->consecLatency * 0.0625) / (float)bwest_str->numConsecLatePkts));
          bwest_str->inWaitLatePkts = (int16_t)(int)((bwest_str->consecLatency * 0.0625) / 30.0);
          bwest_str->start_wait_period = arr_ts;
        }
        if ((uint)rtp_number == bwest_str->prev_rec_rtp_number + 1U) {
          if (((bwest_str->hsn_detect_snd == 0) || (bwest_str->hsn_detect_rec == 0)) &&
             ((float)(frame_length << 4) < arr_time_noise)) {
            if (((float)num_pkts_expected <= 8000.0) || (bwest_str->in_wait_period != 0)) {
              if ((5120.0 < (float)num_pkts_expected) && (bwest_str->in_wait_period == 0)) {
                immediate_set = 0x3f4ccccd;
                bVar2 = true;
                bwest_str->in_wait_period = 0x2c;
                bwest_str->start_wait_period = arr_ts;
              }
            }
            else {
              immediate_set = 0x3f333333;
              bwest_str->in_wait_period = 0x37;
              bwest_str->start_wait_period = arr_ts;
              bVar2 = true;
            }
          }
          if (((bwest_str->rec_bw_avg <= bwest_str->prev_rec_rtp_rate &&
                bwest_str->prev_rec_rtp_rate != bwest_str->rec_bw_avg) &&
              (bwest_str->rec_bw_avg <= fVar3 && fVar3 != bwest_str->rec_bw_avg)) &&
             (bwest_str->in_wait_period == 0)) {
            iVar1 = bwest_str->count_tot_updates_rec;
            bwest_str->count_tot_updates_rec = iVar1 + 1;
            if (iVar1 < 100) {
              rec_rtp_rate = 1.0 / (float)bwest_str->count_tot_updates_rec;
            }
            else {
              rec_rtp_rate = 0.01;
            }
            if ((float)((frame_length * 16000) / 1000) + 400.0 < arr_time_noise) {
              arr_time_noise = (float)((frame_length * 16000) / 1000) + 400.0;
            }
            if (arr_time_noise < (float)((frame_length * 16000) / 1000) - 160.0) {
              arr_time_noise = ((float)frame_length * 16000.0) / 1000.0 - 160.0;
            }
            local_78 = (float)(pksize + 0x23);
            t_diff_proj = arr_time_noise / (local_78 * 8.0 * 16000.0);
            if (t_diff_proj < 1.0 / (bwest_str->rec_header_rate + 56000.0)) {
              t_diff_proj = 1.0 / (bwest_str->rec_header_rate + 56000.0);
            }
            bwest_str->rec_bw_inv =
                 rec_rtp_rate * t_diff_proj + (1.0 - rec_rtp_rate) * bwest_str->rec_bw_inv;
            bwest_str->last_update_ts = arr_ts;
            bwest_str->last_reduction_ts = arr_ts + 48000;
            bwest_str->num_pkts_rec = 0;
            local_84 = (float)(pksize + 0x23);
            fVar5 = (arr_time_noise * 1000.0) / 16000.0 -
                    (local_84 * 8.0 * 1000.0) / bwest_str->rec_bw_avg;
            fVar4 = ABS(fVar5);
            bwest_str->rec_jitter =
                 rec_rtp_rate * fVar4 + (1.0 - rec_rtp_rate) * bwest_str->rec_jitter;
            if (10.0 < bwest_str->rec_jitter) {
              bwest_str->rec_jitter = 10.0;
            }
            bwest_str->rec_jitter_short_term_abs =
                 fVar4 * 0.05 + bwest_str->rec_jitter_short_term_abs * 0.95;
            bwest_str->rec_jitter_short_term =
                 fVar5 * 0.05 + bwest_str->rec_jitter_short_term * 0.95;
          }
        }
      }
      if (1.0 / (bwest_str->rec_header_rate + 10000.0) < bwest_str->rec_bw_inv) {
        bwest_str->rec_bw_inv = 1.0 / (bwest_str->rec_header_rate + 10000.0);
      }
      if (bwest_str->rec_bw_inv < 1.0 / (bwest_str->rec_header_rate + 56000.0)) {
        bwest_str->rec_bw_inv = 1.0 / (bwest_str->rec_header_rate + 56000.0);
      }
      bwest_str->prev_frame_length = frame_length;
      bwest_str->prev_rec_rtp_rate = fVar3;
      bwest_str->prev_rec_rtp_number = (uint)rtp_number;
      bwest_str->rec_max_delay = bwest_str->rec_jitter * 3.0;
      bwest_str->prev_rec_arr_ts = arr_ts;
      bwest_str->prev_rec_send_ts = send_ts;
      bwest_str->rec_bw = (int)(1.0 / bwest_str->rec_bw_inv - bwest_str->rec_header_rate);
      if (bVar2) {
        bwest_str->rec_bw = (int)((float)immediate_set * (float)bwest_str->rec_bw);
        if (bwest_str->rec_bw < 10000) {
          bwest_str->rec_bw = 10000;
        }
        bwest_str->rec_bw_avg = (float)bwest_str->rec_bw + bwest_str->rec_header_rate;
        bwest_str->rec_bw_avg_Q = (float)bwest_str->rec_bw;
        bwest_str->rec_jitter_short_term = 0.0;
        bwest_str->rec_bw_inv = 1.0 / ((float)bwest_str->rec_bw + bwest_str->rec_header_rate);
        bwest_str->count_tot_updates_rec = 1;
        bwest_str->consecLatency = 0.0;
        bwest_str->numConsecLatePkts = 0;
      }
    }
    return 0;
  }
  __assert_fail("!bwest_str->external_bw_info.in_use",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/main/source/bandwidth_estimator.c"
                ,0xa2,
                "int16_t WebRtcIsac_UpdateBandwidthEstimator(BwEstimatorstr *, const uint16_t, const int32_t, const uint32_t, const uint32_t, const size_t)"
               );
}

Assistant:

int16_t WebRtcIsac_UpdateBandwidthEstimator(
    BwEstimatorstr* bwest_str,
    const uint16_t rtp_number,
    const int32_t frame_length,
    const uint32_t send_ts,
    const uint32_t arr_ts,
    const size_t pksize
    /*,    const uint16_t Index*/)
{
  float weight = 0.0f;
  float curr_bw_inv = 0.0f;
  float rec_rtp_rate;
  float t_diff_proj;
  float arr_ts_diff;
  float send_ts_diff;
  float arr_time_noise;
  float arr_time_noise_abs;

  float delay_correction_factor = 1;
  float late_diff = 0.0f;
  int immediate_set = 0;
  int num_pkts_expected;

  assert(!bwest_str->external_bw_info.in_use);

  // We have to adjust the header-rate if the first packet has a
  // frame-size different than the initialized value.
  if ( frame_length != bwest_str->prev_frame_length )
  {
    bwest_str->rec_header_rate = (float)HEADER_SIZE * 8.0f *
        1000.0f / (float)frame_length;     /* bits/s */
  }

  /* UPDATE ESTIMATES ON THIS SIDE */
  /* compute far-side transmission rate */
  rec_rtp_rate = ((float)pksize * 8.0f * 1000.0f / (float)frame_length) +
      bwest_str->rec_header_rate;
  // rec_rtp_rate packet bits/s + header bits/s

  /* check for timer wrap-around */
  if (arr_ts < bwest_str->prev_rec_arr_ts)
  {
    bwest_str->prev_rec_arr_ts   = arr_ts;
    bwest_str->last_update_ts    = arr_ts;
    bwest_str->last_reduction_ts = arr_ts + 3*FS;
    bwest_str->num_pkts_rec      = 0;

    /* store frame length */
    bwest_str->prev_frame_length = frame_length;

    /* store far-side transmission rate */
    bwest_str->prev_rec_rtp_rate = rec_rtp_rate;

    /* store far-side RTP time stamp */
    bwest_str->prev_rec_rtp_number = rtp_number;

    return 0;
  }

  bwest_str->num_pkts_rec++;

  /* check that it's not one of the first 9 packets */
  if ( bwest_str->count_tot_updates_rec > 0 )
  {
    if(bwest_str->in_wait_period > 0 )
    {
      bwest_str->in_wait_period--;
    }

    bwest_str->inWaitLatePkts -= ((bwest_str->inWaitLatePkts > 0)? 1:0);
    send_ts_diff = (float)(send_ts - bwest_str->prev_rec_send_ts);

    if (send_ts_diff <= (16 * frame_length)*2)
      //doesn't allow for a dropped packet, not sure necessary to be
      // that strict -DH
    {
      /* if not been updated for a long time, reduce the BN estimate */
      if((uint32_t)(arr_ts - bwest_str->last_update_ts) *
         1000.0f / FS > 3000)
      {
        //how many frames should have been received since the last
        // update if too many have been dropped or there have been
        // big delays won't allow this reduction may no longer need
        // the send_ts_diff here
        num_pkts_expected = (int)(((float)(arr_ts -
                                           bwest_str->last_update_ts) * 1000.0f /(float) FS) /
                                  (float)frame_length);

        if(((float)bwest_str->num_pkts_rec/(float)num_pkts_expected) >
           0.9)
        {
          float inv_bitrate = (float) pow( 0.99995,
                                           (double)((uint32_t)(arr_ts -
                                                                     bwest_str->last_reduction_ts)*1000.0f/FS) );

          if ( inv_bitrate )
          {
            bwest_str->rec_bw_inv /= inv_bitrate;

            //precautionary, likely never necessary
            if (bwest_str->hsn_detect_snd &&
                bwest_str->hsn_detect_rec)
            {
              if (bwest_str->rec_bw_inv > 0.000066f)
              {
                bwest_str->rec_bw_inv = 0.000066f;
              }
            }
          }
          else
          {
            bwest_str->rec_bw_inv = 1.0f /
                (INIT_BN_EST_WB + INIT_HDR_RATE_WB);
          }
          /* reset time-since-update counter */
          bwest_str->last_reduction_ts = arr_ts;
        }
        else
          //reset here?
        {
          bwest_str->last_reduction_ts = arr_ts + 3*FS;
          bwest_str->last_update_ts = arr_ts;
          bwest_str->num_pkts_rec = 0;
        }
      }
    }
    else
    {
      bwest_str->last_reduction_ts = arr_ts + 3*FS;
      bwest_str->last_update_ts = arr_ts;
      bwest_str->num_pkts_rec = 0;
    }


    /* temporarily speed up adaptation if frame length has changed */
    if ( frame_length != bwest_str->prev_frame_length )
    {
      bwest_str->count_tot_updates_rec = 10;
      bwest_str->rec_header_rate = (float)HEADER_SIZE * 8.0f *
          1000.0f / (float)frame_length;     /* bits/s */

      bwest_str->rec_bw_inv = 1.0f /((float)bwest_str->rec_bw +
                                     bwest_str->rec_header_rate);
    }

    ////////////////////////
    arr_ts_diff = (float)(arr_ts - bwest_str->prev_rec_arr_ts);

    if (send_ts_diff > 0 )
    {
      late_diff = arr_ts_diff - send_ts_diff;
    }
    else
    {
      late_diff = arr_ts_diff - (float)(16 * frame_length);
    }

    if((late_diff > 0) && !bwest_str->inWaitLatePkts)
    {
      bwest_str->numConsecLatePkts++;
      bwest_str->consecLatency += late_diff;
    }
    else
    {
      bwest_str->numConsecLatePkts = 0;
      bwest_str->consecLatency = 0;
    }
    if(bwest_str->numConsecLatePkts > 50)
    {
      float latencyMs = bwest_str->consecLatency/(FS/1000);
      float averageLatencyMs = latencyMs / bwest_str->numConsecLatePkts;
      delay_correction_factor = frame_length / (frame_length + averageLatencyMs);
      immediate_set = 1;
      bwest_str->inWaitLatePkts = (int16_t)((bwest_str->consecLatency/(FS/1000)) / 30);// + 150;
      bwest_str->start_wait_period = arr_ts;
    }
    ///////////////////////////////////////////////



    /*   update only if previous packet was not lost */
    if ( rtp_number == bwest_str->prev_rec_rtp_number + 1 )
    {


      if (!(bwest_str->hsn_detect_snd && bwest_str->hsn_detect_rec))
      {
        if ((arr_ts_diff > (float)(16 * frame_length)))
        {
          //1/2 second
          if ((late_diff > 8000.0f) && !bwest_str->in_wait_period)
          {
            delay_correction_factor = 0.7f;
            bwest_str->in_wait_period = 55;
            bwest_str->start_wait_period = arr_ts;
            immediate_set = 1;
          }
          //320 ms
          else if (late_diff > 5120.0f && !bwest_str->in_wait_period)
          {
            delay_correction_factor = 0.8f;
            immediate_set = 1;
            bwest_str->in_wait_period = 44;
            bwest_str->start_wait_period = arr_ts;
          }
        }
      }


      if ((bwest_str->prev_rec_rtp_rate > bwest_str->rec_bw_avg) &&
          (rec_rtp_rate > bwest_str->rec_bw_avg)                 &&
          !bwest_str->in_wait_period)
      {
        /* test if still in initiation period and increment counter */
        if (bwest_str->count_tot_updates_rec++ > 99)
        {
          /* constant weight after initiation part */
          weight = 0.01f;
        }
        else
        {
          /* weight decreases with number of updates */
          weight = 1.0f / (float) bwest_str->count_tot_updates_rec;
        }
        /* Bottle Neck Estimation */

        /* limit outliers */
        /* if more than 25 ms too much */
        if (arr_ts_diff > frame_length * FS/1000 + 400.0f)
        {
          // in samples,  why 25ms??
          arr_ts_diff = frame_length * FS/1000 + 400.0f;
        }
        if(arr_ts_diff < (frame_length * FS/1000) - 160.0f)
        {
          /* don't allow it to be less than frame rate - 10 ms */
          arr_ts_diff = (float)frame_length * FS/1000 - 160.0f;
        }

        /* compute inverse receiving rate for last packet */
        curr_bw_inv = arr_ts_diff / ((float)(pksize + HEADER_SIZE) *
                                     8.0f * FS); // (180+35)*8*16000 = 27.5 Mbit....


        if(curr_bw_inv <
           (1.0f / (MAX_ISAC_BW + bwest_str->rec_header_rate)))
        {
          // don't allow inv rate to be larger than MAX
          curr_bw_inv = (1.0f /
                         (MAX_ISAC_BW + bwest_str->rec_header_rate));
        }

        /* update bottle neck rate estimate */
        bwest_str->rec_bw_inv = weight * curr_bw_inv +
            (1.0f - weight) * bwest_str->rec_bw_inv;

        /* reset time-since-update counter */
        bwest_str->last_update_ts    = arr_ts;
        bwest_str->last_reduction_ts = arr_ts + 3 * FS;
        bwest_str->num_pkts_rec = 0;

        /* Jitter Estimation */
        /* projected difference between arrival times */
        t_diff_proj = ((float)(pksize + HEADER_SIZE) * 8.0f *
                       1000.0f) / bwest_str->rec_bw_avg;


        // difference between projected and actual
        //   arrival time differences
        arr_time_noise = (float)(arr_ts_diff*1000.0f/FS) -
            t_diff_proj;
        arr_time_noise_abs = (float) fabs( arr_time_noise );

        /* long term averaged absolute jitter */
        bwest_str->rec_jitter = weight * arr_time_noise_abs +
            (1.0f - weight) * bwest_str->rec_jitter;
        if (bwest_str->rec_jitter > 10.0f)
        {
          bwest_str->rec_jitter = 10.0f;
        }
        /* short term averaged absolute jitter */
        bwest_str->rec_jitter_short_term_abs = 0.05f *
            arr_time_noise_abs + 0.95f *
            bwest_str->rec_jitter_short_term_abs;

        /* short term averaged jitter */
        bwest_str->rec_jitter_short_term = 0.05f * arr_time_noise +
            0.95f * bwest_str->rec_jitter_short_term;
      }
    }
  }
  else
  {
    // reset time-since-update counter when
    // receiving the first 9 packets
    bwest_str->last_update_ts    = arr_ts;
    bwest_str->last_reduction_ts = arr_ts + 3*FS;
    bwest_str->num_pkts_rec = 0;

    bwest_str->count_tot_updates_rec++;
  }

  /* limit minimum bottle neck rate */
  if (bwest_str->rec_bw_inv > 1.0f / ((float)MIN_ISAC_BW +
                                      bwest_str->rec_header_rate))
  {
    bwest_str->rec_bw_inv = 1.0f / ((float)MIN_ISAC_BW +
                                    bwest_str->rec_header_rate);
  }

  // limit maximum bitrate
  if (bwest_str->rec_bw_inv < 1.0f / ((float)MAX_ISAC_BW +
                                      bwest_str->rec_header_rate))
  {
    bwest_str->rec_bw_inv = 1.0f / ((float)MAX_ISAC_BW +
                                    bwest_str->rec_header_rate);
  }

  /* store frame length */
  bwest_str->prev_frame_length = frame_length;

  /* store far-side transmission rate */
  bwest_str->prev_rec_rtp_rate = rec_rtp_rate;

  /* store far-side RTP time stamp */
  bwest_str->prev_rec_rtp_number = rtp_number;

  // Replace bwest_str->rec_max_delay by the new
  // value (atomic operation)
  bwest_str->rec_max_delay = 3.0f * bwest_str->rec_jitter;

  /* store send and arrival time stamp */
  bwest_str->prev_rec_arr_ts = arr_ts ;
  bwest_str->prev_rec_send_ts = send_ts;

  /* Replace bwest_str->rec_bw by the new value (atomic operation) */
  bwest_str->rec_bw = (int32_t)(1.0f / bwest_str->rec_bw_inv -
                                      bwest_str->rec_header_rate);

  if (immediate_set)
  {
    bwest_str->rec_bw = (int32_t) (delay_correction_factor *
                                         (float) bwest_str->rec_bw);

    if (bwest_str->rec_bw < (int32_t) MIN_ISAC_BW)
    {
      bwest_str->rec_bw = (int32_t) MIN_ISAC_BW;
    }

    bwest_str->rec_bw_avg = bwest_str->rec_bw +
        bwest_str->rec_header_rate;

    bwest_str->rec_bw_avg_Q = (float) bwest_str->rec_bw;

    bwest_str->rec_jitter_short_term = 0.0f;

    bwest_str->rec_bw_inv = 1.0f / (bwest_str->rec_bw +
                                    bwest_str->rec_header_rate);

    bwest_str->count_tot_updates_rec = 1;

    immediate_set = 0;
    bwest_str->consecLatency = 0;
    bwest_str->numConsecLatePkts = 0;
  }

  return 0;
}